

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         write_significand<char,fmt::v10::appender,unsigned_int,fmt::v10::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  appender out_00;
  format_decimal_result<char_*> fVar2;
  char buffer_2 [10];
  memory_buffer buffer;
  char local_248 [16];
  undefined **local_238;
  undefined2 local_230;
  undefined6 uStack_22e;
  size_t local_228;
  ulong local_220;
  undefined1 local_218 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    local_230 = 0;
    local_238 = (undefined **)0x0;
    fVar2 = format_decimal<char,unsigned_int>((char *)&local_238,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_238,fVar2.end,out);
    local_238 = (undefined **)CONCAT71(local_238._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)fill_n<fmt::v10::appender,int,char>(out_00,exponent,(char *)&local_238);
  }
  else {
    local_228 = 0;
    local_238 = &PTR_grow_001f1ef8;
    local_230 = SUB82(local_218,0);
    uStack_22e = (undefined6)((ulong)local_218 >> 0x10);
    local_220 = 500;
    local_248[0] = '\0';
    local_248[1] = '\0';
    local_248[2] = '\0';
    local_248[3] = '\0';
    local_248[4] = '\0';
    local_248[5] = '\0';
    local_248[6] = '\0';
    local_248[7] = '\0';
    local_248[8] = '\0';
    local_248[9] = '\0';
    fVar2 = format_decimal<char,unsigned_int>(local_248,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v10::appender>(local_248,fVar2.end,(appender)&local_238);
    local_248[0] = 0x30;
    fill_n<fmt::v10::appender,int,char>((appender)&local_238,exponent,local_248);
    digits.data_._2_6_ = uStack_22e;
    digits.data_._0_2_ = local_230;
    digits.size_ = local_228;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    if ((undefined1 *)CONCAT62(uStack_22e,local_230) != local_218) {
      operator_delete((undefined1 *)CONCAT62(uStack_22e,local_230),local_220);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}